

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O1

RTPTransmissionInfo * __thiscall
jrtplib::RTPUDPv6Transmitter::GetTransmissionInfo(RTPUDPv6Transmitter *this)

{
  RTPMemoryManager *pRVar1;
  _List_node_base *p_Var2;
  RTPUDPv6TransmissionInfo *this_00;
  list<in6_addr,_std::allocator<in6_addr>_> local_40;
  
  if (this->init == true) {
    pRVar1 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
    if (pRVar1 == (RTPMemoryManager *)0x0) {
      this_00 = (RTPUDPv6TransmissionInfo *)operator_new(0x38);
    }
    else {
      this_00 = (RTPUDPv6TransmissionInfo *)(**(code **)(*(long *)pRVar1 + 0x10))(pRVar1,0x38,0x1c);
    }
    std::__cxx11::list<in6_addr,_std::allocator<in6_addr>_>::list(&local_40,&this->localIPs);
    RTPUDPv6TransmissionInfo::RTPUDPv6TransmissionInfo
              (this_00,&local_40,this->rtpsock,this->rtcpsock,this->portbase,this->portbase + 1);
    while (local_40.super__List_base<in6_addr,_std::allocator<in6_addr>_>._M_impl._M_node.
           super__List_node_base._M_next != (_List_node_base *)&local_40) {
      p_Var2 = (((_List_base<in6_addr,_std::allocator<in6_addr>_> *)
                &(local_40.super__List_base<in6_addr,_std::allocator<in6_addr>_>._M_impl._M_node.
                  super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.super__List_node_base.
               _M_next;
      operator_delete(local_40.super__List_base<in6_addr,_std::allocator<in6_addr>_>._M_impl._M_node
                      .super__List_node_base._M_next,0x20);
      local_40.super__List_base<in6_addr,_std::allocator<in6_addr>_>._M_impl._M_node.
      super__List_node_base._M_next = p_Var2;
    }
  }
  else {
    this_00 = (RTPUDPv6TransmissionInfo *)0x0;
  }
  return &this_00->super_RTPTransmissionInfo;
}

Assistant:

RTPTransmissionInfo *RTPUDPv6Transmitter::GetTransmissionInfo()
{
	if (!init)
		return 0;

	MAINMUTEX_LOCK
	RTPTransmissionInfo *tinf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPTRANSMISSIONINFO) RTPUDPv6TransmissionInfo(localIPs,rtpsock,rtcpsock,portbase,portbase+1);
	MAINMUTEX_UNLOCK
	return tinf;
}